

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_staging.cc
# Opt level: O3

int __thiscall NarpcStaging::SendBytes(NarpcStaging *this,int socket,uchar *buf,int size)

{
  long *plVar1;
  ssize_t sVar2;
  uint uVar3;
  int iVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sending buf of size ",0x14);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,size);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  sVar2 = send(socket,buf,(long)size,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"res ",4);
  iVar4 = (int)sVar2;
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  if (-1 < iVar4) {
    uVar3 = size - iVar4;
    do {
      if ((int)uVar3 < 1) {
        return uVar3;
      }
      sVar2 = send(socket,buf + (int)(size - uVar3),(ulong)uVar3,0);
      iVar4 = (int)sVar2;
      uVar3 = uVar3 - iVar4;
    } while (-1 < iVar4);
  }
  return iVar4;
}

Assistant:

int NarpcStaging::SendBytes(int socket, unsigned char *buf, int size) {
  cout << "sending buf of size " << size << endl;
  int res = send(socket, buf, (size_t)size, (int)0);
  cout << "res " << res << endl;
  if (res < 0) {
    return res;
  }
  int remaining = size - res;
  while (remaining > 0) {
    int offset = size - remaining;
    res = send(socket, buf + offset, (size_t)remaining, (int)0);
    if (res < 0) {
      return res;
    }
    remaining -= res;
  }
  return remaining;
}